

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlink-ipi.c
# Opt level: O0

mraa_board_t * mraa_lec_al_board(void)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  mraa_board_t *board;
  __ssize_t _Var5;
  size_t sVar6;
  mraa_pininfo_t *pmVar7;
  mraa_adv_func_t *pmVar8;
  ssize_t sVar9;
  char *pcVar10;
  int have_pinctrl;
  char *pinctrl_path;
  mraa_pincapabilities_t local_128;
  mraa_pincapabilities_t local_124;
  mraa_pincapabilities_t local_120;
  mraa_pincapabilities_t local_11c;
  mraa_pincapabilities_t local_118;
  mraa_pincapabilities_t local_114;
  mraa_pincapabilities_t local_110;
  mraa_pincapabilities_t local_10c;
  mraa_pincapabilities_t local_108;
  mraa_pincapabilities_t local_104;
  mraa_pincapabilities_t local_100;
  mraa_pincapabilities_t local_fc;
  mraa_pincapabilities_t local_f8;
  mraa_pincapabilities_t local_f4;
  mraa_pincapabilities_t local_f0;
  mraa_pincapabilities_t local_ec;
  mraa_pincapabilities_t local_e8;
  mraa_pincapabilities_t local_e4;
  mraa_pincapabilities_t local_e0;
  mraa_pincapabilities_t local_dc;
  mraa_pincapabilities_t local_d8;
  mraa_pincapabilities_t local_d4;
  mraa_pincapabilities_t local_d0;
  mraa_pincapabilities_t local_cc;
  mraa_pincapabilities_t local_c8;
  mraa_pincapabilities_t local_c4;
  mraa_pincapabilities_t local_c0;
  mraa_pincapabilities_t local_bc;
  mraa_pincapabilities_t local_b8;
  mraa_pincapabilities_t local_b4;
  mraa_pincapabilities_t local_b0;
  mraa_pincapabilities_t local_ac;
  mraa_pincapabilities_t local_a8;
  mraa_pincapabilities_t local_a4;
  mraa_pincapabilities_t local_a0;
  mraa_pincapabilities_t local_9c;
  mraa_pincapabilities_t local_98;
  mraa_pincapabilities_t local_94;
  mraa_pincapabilities_t local_90;
  int count;
  mraa_board_t *b;
  size_t len;
  FILE *fh;
  char *line;
  char buffer [60];
  int local_20;
  int local_1c;
  int lecalai;
  int i2c_bus_num;
  int fd;
  int i;
  
  local_20 = -1;
  memset(&line,0,0x3c);
  fh = (FILE *)0x0;
  board = (mraa_board_t *)calloc(1,0x5f0);
  if (board != (mraa_board_t *)0x0) {
    len = (size_t)fopen("/sys/devices/virtual/dmi/id/product_name","r");
    if ((FILE *)len != (FILE *)0x0) {
      _Var5 = getline((char **)&fh,(size_t *)&b,(FILE *)len);
      pFVar1 = fh;
      if (_Var5 != -1) {
        sVar6 = strcspn((char *)fh,"\r\n");
        *(undefined1 *)((long)&pFVar1->_flags + sVar6) = 0;
        iVar2 = strncasecmp((char *)fh,"LEC-AL-AI",10);
        if ((iVar2 == 0) || (iVar2 = strncasecmp((char *)fh,"LEC-ALAI",9), iVar2 == 0)) {
          board->platform_name = "LEC-AL AI";
          local_20 = 1;
        }
        else {
          local_20 = 0;
          board->platform_name = "LEC-AL";
        }
      }
      fclose((FILE *)len);
    }
    board->phy_pin_count = 0x29;
    board->gpio_count = 0x11;
    board->chardev_capable = 0;
    pmVar7 = (mraa_pininfo_t *)malloc(0x7914);
    board->pins = pmVar7;
    if (board->pins != (mraa_pininfo_t *)0x0) {
      pmVar8 = (mraa_adv_func_t *)calloc(1,0x288);
      board->adv_func = pmVar8;
      if (board->adv_func != (mraa_adv_func_t *)0x0) {
        board->adv_func->gpio_isr_replace = gpio_isr_replace;
        board->adv_func->gpio_close_pre = gpio_close_pre;
        board->adv_func->gpio_init_pre = gpio_init_pre;
        board->adv_func->pwm_init_raw_replace = pwm_init_raw_replace;
        board->adv_func->pwm_period_replace = pwm_period_replace;
        board->adv_func->pwm_read_replace = pwm_read_replace;
        board->adv_func->pwm_write_replace = pwm_write_replace;
        board->adv_func->pwm_enable_replace = pwm_enable_replace;
        for (i2c_bus_num = 0; i2c_bus_num < 999; i2c_bus_num = i2c_bus_num + 1) {
          snprintf((char *)&line,0x3c,"/sys/class/gpio/gpiochip%d/device/name",
                   (ulong)(uint)i2c_bus_num);
          iVar2 = open((char *)&line,0);
          if (iVar2 != -1) {
            sVar9 = read(iVar2,&line,7);
            iVar4 = (int)sVar9;
            if (iVar4 != 0) {
              iVar3 = strncmp((char *)&line,"sx1509q",(long)iVar4);
              if (iVar3 == 0) {
                base2 = i2c_bus_num;
              }
              iVar4 = strncmp((char *)&line,"pca9535",(long)iVar4);
              if (iVar4 == 0) {
                base1 = i2c_bus_num;
              }
            }
            close(iVar2);
          }
        }
        syslog(5,"lec_al: base1 %d base2 %d\n",(ulong)(uint)base1,(ulong)(uint)base2);
        board->pwm_dev_count = 0;
        board->pwm_default_period = 5000;
        board->pwm_max_period = 0x35555;
        board->pwm_min_period = 1;
        local_90._0_1_ = 1;
        mraa_lec_al_set_pininfo(board,1,"3v3",local_90,-1);
        local_94._0_1_ = 1;
        mraa_lec_al_set_pininfo(board,2,"5v",local_94,-1);
        local_98._0_1_ = 0x21;
        mraa_lec_al_set_pininfo(board,3,"I2C0_DAT",local_98,-1);
        local_9c._0_1_ = 1;
        mraa_lec_al_set_pininfo(board,4,"5v",local_9c,-1);
        local_a0._0_1_ = 0x21;
        mraa_lec_al_set_pininfo(board,5,"I2C0_CK",local_a0,-1);
        local_a4._0_1_ = 1;
        mraa_lec_al_set_pininfo(board,6,"GND",local_a4,-1);
        local_a8._0_1_ = 3;
        mraa_lec_al_set_pininfo(board,7,"GPIO04",local_a8,base1 + 4);
        local_ac._0_1_ = 0x81;
        mraa_lec_al_set_pininfo(board,8,"UART_TXD",local_ac,-1);
        local_b0._0_1_ = 1;
        mraa_lec_al_set_pininfo(board,9,"GND",local_b0,-1);
        local_b4._0_1_ = 0x81;
        mraa_lec_al_set_pininfo(board,10,"UART_RXD",local_b4,-1);
        local_b8._0_1_ = 3;
        mraa_lec_al_set_pininfo(board,0xb,"GPIO05",local_b8,base1 + 6);
        local_bc._0_1_ = 3;
        mraa_lec_al_set_pininfo(board,0xc,"GPIO06",local_bc,base1 + 5);
        board->pins[0xc].pwm.parent_id = 0;
        board->pins[0xc].pwm.pinmap = 9;
        board->pwm_dev_count = board->pwm_dev_count + 1;
        local_c0._0_1_ = 3;
        mraa_lec_al_set_pininfo(board,0xd,"GPIO07",local_c0,base1 + 7);
        local_c4._0_1_ = 1;
        mraa_lec_al_set_pininfo(board,0xe,"GND",local_c4,-1);
        local_c8._0_1_ = 3;
        mraa_lec_al_set_pininfo(board,0xf,"GPIO08",local_c8,base1 + 8);
        local_cc._0_1_ = 3;
        mraa_lec_al_set_pininfo(board,0x10,"GPIO09",local_cc,base1 + 9);
        local_d0._0_1_ = 1;
        mraa_lec_al_set_pininfo(board,0x11,"3v3",local_d0,-1);
        local_d4._0_1_ = 3;
        mraa_lec_al_set_pininfo(board,0x12,"GPIO10",local_d4,base1 + 10);
        local_d8._0_1_ = 0x11;
        mraa_lec_al_set_pininfo(board,0x13,"SPI_0_MOSI",local_d8,-1);
        local_dc._0_1_ = 1;
        mraa_lec_al_set_pininfo(board,0x14,"GND",local_dc,-1);
        local_e0._0_1_ = 0x11;
        mraa_lec_al_set_pininfo(board,0x15,"SPI_0_MISO",local_e0,-1);
        local_e4._0_1_ = 3;
        mraa_lec_al_set_pininfo(board,0x16,"GPIO11",local_e4,base1 + 0xb);
        local_e8._0_1_ = 0x11;
        mraa_lec_al_set_pininfo(board,0x17,"SPI_0_SCLK",local_e8,-1);
        local_ec._0_1_ = 0x11;
        mraa_lec_al_set_pininfo(board,0x18,"SPI_0_CE0",local_ec,-1);
        local_f0._0_1_ = 1;
        mraa_lec_al_set_pininfo(board,0x19,"GND",local_f0,-1);
        local_f4._0_1_ = 0x11;
        mraa_lec_al_set_pininfo(board,0x1a,"SPI_0_CE1",local_f4,-1);
        local_f8._0_1_ = 0x21;
        mraa_lec_al_set_pininfo(board,0x1b,"I2C1_DAT",local_f8,-1);
        local_fc._0_1_ = 0x21;
        mraa_lec_al_set_pininfo(board,0x1c,"I2C1_CK",local_fc,-1);
        local_100 = (mraa_pincapabilities_t)(CONCAT31(local_100._1_3_,3) | 4);
        mraa_lec_al_set_pininfo(board,0x1d,"GPIO1_0",local_100,base2);
        board->pins[0x1d].pwm.parent_id = 1;
        board->pins[0x1d].pwm.pinmap = 0;
        board->pwm_dev_count = board->pwm_dev_count + 1;
        local_104._0_1_ = 1;
        mraa_lec_al_set_pininfo(board,0x1e,"GND",local_104,-1);
        local_108 = (mraa_pincapabilities_t)(CONCAT31(local_108._1_3_,3) | 4);
        mraa_lec_al_set_pininfo(board,0x1f,"GPIO1_1",local_108,base2 + 1);
        board->pins[0x1f].pwm.parent_id = 1;
        board->pins[0x1f].pwm.pinmap = 1;
        board->pwm_dev_count = board->pwm_dev_count + 1;
        local_10c = (mraa_pincapabilities_t)(CONCAT31(local_10c._1_3_,3) | 4);
        mraa_lec_al_set_pininfo(board,0x20,"GPIO1_2",local_10c,base2 + 2);
        board->pins[0x20].pwm.parent_id = 1;
        board->pins[0x20].pwm.pinmap = 2;
        board->pwm_dev_count = board->pwm_dev_count + 1;
        local_110 = (mraa_pincapabilities_t)(CONCAT31(local_110._1_3_,3) | 4);
        mraa_lec_al_set_pininfo(board,0x21,"GPIO1_3",local_110,base2 + 3);
        board->pins[0x21].pwm.parent_id = 1;
        board->pins[0x21].pwm.pinmap = 3;
        board->pwm_dev_count = board->pwm_dev_count + 1;
        local_114._0_1_ = 1;
        mraa_lec_al_set_pininfo(board,0x22,"GND",local_114,-1);
        local_118 = (mraa_pincapabilities_t)(CONCAT31(local_118._1_3_,3) | 4);
        mraa_lec_al_set_pininfo(board,0x23,"GPIO1_4",local_118,base2 + 4);
        board->pins[0x23].pwm.parent_id = 1;
        board->pins[0x23].pwm.pinmap = 4;
        board->pwm_dev_count = board->pwm_dev_count + 1;
        local_11c = (mraa_pincapabilities_t)(CONCAT31(local_11c._1_3_,3) | 4);
        mraa_lec_al_set_pininfo(board,0x24,"GPIO1_5",local_11c,base2 + 5);
        board->pins[0x24].pwm.parent_id = 1;
        board->pins[0x24].pwm.pinmap = 5;
        board->pwm_dev_count = board->pwm_dev_count + 1;
        local_120 = (mraa_pincapabilities_t)(CONCAT31(local_120._1_3_,3) | 4);
        mraa_lec_al_set_pininfo(board,0x25,"GPIO1_6",local_120,base2 + 6);
        board->pins[0x25].pwm.parent_id = 1;
        board->pins[0x25].pwm.pinmap = 6;
        board->pwm_dev_count = board->pwm_dev_count + 1;
        local_124 = (mraa_pincapabilities_t)(CONCAT31(local_124._1_3_,3) | 4);
        mraa_lec_al_set_pininfo(board,0x26,"GPIO1_7",local_124,base2 + 7);
        board->pins[0x26].pwm.parent_id = 1;
        board->pins[0x26].pwm.pinmap = 7;
        board->pwm_dev_count = board->pwm_dev_count + 1;
        local_128._0_1_ = 1;
        mraa_lec_al_set_pininfo(board,0x27,"GND",local_128,-1);
        pinctrl_path._4_4_ = (mraa_pincapabilities_t)(CONCAT31(pinctrl_path._5_3_,3) | 4);
        mraa_lec_al_set_pininfo(board,0x28,"GPIO2_8",pinctrl_path._4_4_,base2 + 8);
        board->pins[0x28].pwm.parent_id = 1;
        board->pins[0x28].pwm.pinmap = 8;
        board->pwm_dev_count = board->pwm_dev_count + 1;
        board->uart_dev_count = 1;
        mraa_lec_al_get_pin_index(board,"UART_RXD",&board->uart_dev[0].rx);
        mraa_lec_al_get_pin_index(board,"UART_TXD",&board->uart_dev[0].tx);
        board->uart_dev[0].device_path = "/dev/ttyS4";
        board->def_uart_dev = 0;
        board->spi_bus_count = 0;
        board->spi_bus[board->spi_bus_count].bus_id = 1;
        board->spi_bus[board->spi_bus_count].slave_s = 0;
        mraa_lec_al_get_pin_index(board,"SPI_0_CE0",&board->spi_bus[board->spi_bus_count].cs);
        mraa_lec_al_get_pin_index(board,"SPI_0_MOSI",&board->spi_bus[board->spi_bus_count].mosi);
        mraa_lec_al_get_pin_index(board,"SPI_0_MISO",&board->spi_bus[board->spi_bus_count].miso);
        mraa_lec_al_get_pin_index(board,"SPI_0_SCLK",&board->spi_bus[board->spi_bus_count].sclk);
        board->spi_bus_count = board->spi_bus_count + 1;
        board->spi_bus[board->spi_bus_count].bus_id = 1;
        board->spi_bus[board->spi_bus_count].slave_s = 1;
        mraa_lec_al_get_pin_index(board,"SPI_0_CE1",&board->spi_bus[board->spi_bus_count].cs);
        mraa_lec_al_get_pin_index(board,"SPI_0_MOSI",&board->spi_bus[board->spi_bus_count].mosi);
        mraa_lec_al_get_pin_index(board,"SPI_0_MISO",&board->spi_bus[board->spi_bus_count].miso);
        mraa_lec_al_get_pin_index(board,"SPI_0_SCLK",&board->spi_bus[board->spi_bus_count].sclk);
        board->spi_bus_count = board->spi_bus_count + 1;
        board->i2c_bus_count = 0;
        board->def_i2c_bus = 0;
        local_1c = mraa_find_i2c_bus_pci("0000:00","0000:00:16.1","i2c_designware.1");
        if (local_1c != -1) {
          iVar2 = sx150x_init(local_1c);
          if (iVar2 < 0) {
            _fd = -1;
          }
          board->i2c_bus[0].bus_id = local_1c;
          mraa_lec_al_get_pin_index(board,"I2C1_DAT",&board->i2c_bus[1].sda);
          mraa_lec_al_get_pin_index(board,"I2C1_CK",&board->i2c_bus[1].scl);
          board->i2c_bus_count = board->i2c_bus_count + 1;
        }
        if (local_20 == 1) {
          local_1c = mraa_find_i2c_bus_pci("0000:00","0000:00:16.3","i2c_designware.3");
        }
        else if (local_20 == 0) {
          local_1c = mraa_find_i2c_bus_pci("0000:00","0000:00:1f.1",".");
        }
        if (local_1c != -1) {
          board->i2c_bus[1].bus_id = local_1c;
          mraa_lec_al_get_pin_index(board,"I2C0_DAT",&board->i2c_bus[0].sda);
          mraa_lec_al_get_pin_index(board,"I2C0_CK",&board->i2c_bus[0].scl);
          board->i2c_bus_count = board->i2c_bus_count + 1;
        }
        iVar2 = access("/sys/bus/platform/drivers/broxton-pinctrl",0);
        pcVar10 = "un";
        if (iVar2 != -1) {
          pcVar10 = "";
        }
        syslog(5,"lec_al: kernel pinctrl driver %savailable",pcVar10);
        return board;
      }
      free(board->pins);
    }
    syslog(2,"lec_al: Platform failed to initialise");
    free(board);
    close(_fd);
  }
  return (mraa_board_t *)0x0;
}

Assistant:

mraa_board_t* mraa_lec_al_board()
{
	int i, fd, i2c_bus_num;
	int lecalai  = -1;
	char buffer[60] = {0}, *line = NULL;
	FILE *fh;
	size_t len;

	mraa_board_t* b = (mraa_board_t*) calloc(1, sizeof (mraa_board_t));

	if (b == NULL) {
		return NULL;
	}

	if((fh = fopen("/sys/devices/virtual/dmi/id/product_name", "r")) != NULL) {
		if (getline(&line, &len, fh) != -1) {
			line[strcspn(line, "\r\n")] = 0;
			if ((strncasecmp(line, "LEC-AL-AI", strlen("LEC-AL-AI") + 1) == 0)\
				       || (strncasecmp(line, "LEC-ALAI", strlen("LEC-ALAI") + 1) == 0)) {
				b->platform_name = PLATFORM_NAME_AI;
				lecalai = 1;
			}
			else
			{
				lecalai = 0;
				b->platform_name = PLATFORM_NAME;
			}
		}
		fclose(fh);
	}

	b->phy_pin_count = MRAA_LEC_AL_PINCOUNT;
	b->gpio_count = MRAA_LEC_AL_GPIOCOUNT;
	b->chardev_capable = 0;

	b->pins = (mraa_pininfo_t*) malloc(sizeof(mraa_pininfo_t) * MRAA_LEC_AL_PINCOUNT);
	if (b->pins == NULL) {
		goto error;
	}

	b->adv_func = (mraa_adv_func_t *) calloc(1, sizeof (mraa_adv_func_t));
	if (b->adv_func == NULL) {
		free(b->pins);
		goto error;
	}

	b->adv_func->gpio_isr_replace = gpio_isr_replace;
	b->adv_func->gpio_close_pre = gpio_close_pre;
	b->adv_func->gpio_init_pre = gpio_init_pre;

	// initializations of pwm functions
	b->adv_func->pwm_init_raw_replace = pwm_init_raw_replace;
	b->adv_func->pwm_period_replace = pwm_period_replace;
	b->adv_func->pwm_read_replace = pwm_read_replace;
	b->adv_func->pwm_write_replace = pwm_write_replace;
	b->adv_func->pwm_enable_replace = pwm_enable_replace;

	for(i = 0; i < 999; i++)
	{
		snprintf(buffer, sizeof(buffer), "/sys/class/gpio/gpiochip%d/device/name",i);
		if((fd = open(buffer, O_RDONLY)) != -1)
		{
			int count = read(fd,buffer,7);
			if(count != 0)
			{
				if(strncmp(buffer, "sx1509q", count) == 0)
				{
					base2 = i;
				}
				if(strncmp(buffer, "pca9535", count) == 0)
				{
					base1 = i;
				}
			}
			close(fd);
		}
	}

	syslog(LOG_NOTICE, "lec_al: base1 %d base2 %d\n", base1, base2);

	// Configure PWM
	b->pwm_dev_count = 0;
	b->pwm_default_period = 5000;
	b->pwm_max_period = 218453;
	b->pwm_min_period = 1;

	mraa_lec_al_set_pininfo(b, 1,  "3v3",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 2,  "5v",         (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 3,  "I2C0_DAT",   (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 4,  "5v",         (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 5,  "I2C0_CK",    (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 6,  "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 7,  "GPIO04",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 4);
	mraa_lec_al_set_pininfo(b, 8,  "UART_TXD",   (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, -1);
	mraa_lec_al_set_pininfo(b, 9,  "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 10, "UART_RXD",   (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, -1);
	mraa_lec_al_set_pininfo(b, 11, "GPIO05",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 6);
	mraa_lec_al_set_pininfo(b, 12, "GPIO06",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 5);
	b->pins[12].pwm.parent_id = 0;
	b->pins[12].pwm.pinmap = 9;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 13, "GPIO07",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 7);
	mraa_lec_al_set_pininfo(b, 14, "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 15, "GPIO08",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 8);
	mraa_lec_al_set_pininfo(b, 16, "GPIO09",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 9);
	mraa_lec_al_set_pininfo(b, 17, "3v3",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 18, "GPIO10",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 10);
	mraa_lec_al_set_pininfo(b, 19, "SPI_0_MOSI", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 20, "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 21, "SPI_0_MISO", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 22, "GPIO11",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 11);
	mraa_lec_al_set_pininfo(b, 23, "SPI_0_SCLK", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 24, "SPI_0_CE0",  (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 25, "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 26, "SPI_0_CE1",  (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 27, "I2C1_DAT",   (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 28, "I2C1_CK",    (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 }, -1);

	mraa_lec_al_set_pininfo(b, 29, "GPIO1_0",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 0);
	b->pins[29].pwm.parent_id = 1;
	b->pins[29].pwm.pinmap = 0;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 30, "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 31, "GPIO1_1",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 1);
	b->pins[31].pwm.parent_id = 1;
	b->pins[31].pwm.pinmap = 1;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 32, "GPIO1_2",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 2);
	b->pins[32].pwm.parent_id = 1;
	b->pins[32].pwm.pinmap = 2;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 33, "GPIO1_3",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 3);
	b->pins[33].pwm.parent_id = 1;
	b->pins[33].pwm.pinmap = 3;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 34, "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 35, "GPIO1_4",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 4);
	b->pins[35].pwm.parent_id = 1;
	b->pins[35].pwm.pinmap = 4;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 36, "GPIO1_5",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 5);
	b->pins[36].pwm.parent_id = 1;
	b->pins[36].pwm.pinmap = 5;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 37, "GPIO1_6",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 6);
	b->pins[37].pwm.parent_id = 1;
	b->pins[37].pwm.pinmap = 6;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 38, "GPIO1_7",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 7);
	b->pins[38].pwm.parent_id = 1;
	b->pins[38].pwm.pinmap = 7;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 39, "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 40, "GPIO2_8",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 8);
	b->pins[40].pwm.parent_id = 1;
	b->pins[40].pwm.pinmap = 8;
	b->pwm_dev_count++;


	// Configure UART #1 (default)
	b->uart_dev_count = 1;

	mraa_lec_al_get_pin_index(b, "UART_RXD",  &(b->uart_dev[0].rx));
	mraa_lec_al_get_pin_index(b, "UART_TXD",  &(b->uart_dev[0].tx));
	b->uart_dev[0].device_path = "/dev/ttyS4";

	b->def_uart_dev = 0;

	// Configure SPI #0 CS1
	b->spi_bus_count = 0;
	b->spi_bus[b->spi_bus_count].bus_id = 1;
	b->spi_bus[b->spi_bus_count].slave_s = 0;
	mraa_lec_al_get_pin_index(b, "SPI_0_CE0",  &(b->spi_bus[b->spi_bus_count].cs));
	mraa_lec_al_get_pin_index(b, "SPI_0_MOSI", &(b->spi_bus[b->spi_bus_count].mosi));
	mraa_lec_al_get_pin_index(b, "SPI_0_MISO", &(b->spi_bus[b->spi_bus_count].miso));
	mraa_lec_al_get_pin_index(b, "SPI_0_SCLK",  &(b->spi_bus[b->spi_bus_count].sclk));
	b->spi_bus_count++;

	b->spi_bus[b->spi_bus_count].bus_id = 1;
	b->spi_bus[b->spi_bus_count].slave_s = 1;
	mraa_lec_al_get_pin_index(b, "SPI_0_CE1",  &(b->spi_bus[b->spi_bus_count].cs));
	mraa_lec_al_get_pin_index(b, "SPI_0_MOSI", &(b->spi_bus[b->spi_bus_count].mosi));
	mraa_lec_al_get_pin_index(b, "SPI_0_MISO", &(b->spi_bus[b->spi_bus_count].miso));
	mraa_lec_al_get_pin_index(b, "SPI_0_SCLK",  &(b->spi_bus[b->spi_bus_count].sclk));
	b->spi_bus_count++;

	// Set number of i2c adaptors usable from userspace
	b->i2c_bus_count = 0;
	b->def_i2c_bus = 0;

	i2c_bus_num = mraa_find_i2c_bus_pci("0000:00", "0000:00:16.1", "i2c_designware.1");
	if (i2c_bus_num != -1) {
		if(sx150x_init(i2c_bus_num) < 0)
		{
			_fd = -1;
		}

		b->i2c_bus[0].bus_id = i2c_bus_num;
		mraa_lec_al_get_pin_index(b, "I2C1_DAT", (int*) &(b->i2c_bus[1].sda));
		mraa_lec_al_get_pin_index(b, "I2C1_CK", (int*) &(b->i2c_bus[1].scl));
		b->i2c_bus_count++;
	}

	if(lecalai == 1)
	{
		i2c_bus_num = mraa_find_i2c_bus_pci("0000:00", "0000:00:16.3", "i2c_designware.3");
	}
	else if(lecalai == 0)
	{
		i2c_bus_num = mraa_find_i2c_bus_pci("0000:00", "0000:00:1f.1", ".");
	}
	if (i2c_bus_num != -1) {
		b->i2c_bus[1].bus_id = i2c_bus_num;
		mraa_lec_al_get_pin_index(b, "I2C0_DAT", (int*) &(b->i2c_bus[0].sda));
		mraa_lec_al_get_pin_index(b, "I2C0_CK", (int*) &(b->i2c_bus[0].scl));
		b->i2c_bus_count++;
	}

	const char* pinctrl_path = "/sys/bus/platform/drivers/broxton-pinctrl";
	int have_pinctrl = access(pinctrl_path, F_OK) != -1;
	syslog(LOG_NOTICE, "lec_al: kernel pinctrl driver %savailable", have_pinctrl ? "" : "un");

	return b;

error:
	syslog(LOG_CRIT, "lec_al: Platform failed to initialise");
	free(b);
	close(_fd);
	return NULL;
}